

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O1

wchar_t gnu_sparse_01_parse(archive_read *a,tar *tar,char *p,size_t length)

{
  char *pcVar1;
  wchar_t wVar2;
  int64_t size;
  int64_t remaining;
  char cVar3;
  long offset;
  char *pcVar4;
  bool bVar5;
  
  offset = -1;
  do {
    bVar5 = length == 0;
    pcVar4 = p;
    if ((!bVar5) && (cVar3 = *p, cVar3 != ',')) {
      pcVar1 = p + length;
      do {
        if ((byte)(cVar3 - 0x3aU) < 0xf6) {
          return L'\xffffffec';
        }
        bVar5 = length == 1;
        if (bVar5) {
          length = 0;
          pcVar4 = pcVar1;
          break;
        }
        cVar3 = pcVar4[1];
        pcVar4 = pcVar4 + 1;
        length = length - 1;
      } while (cVar3 != ',');
    }
    remaining = tar_atol_base_n(p,(long)pcVar4 - (long)p,L'\n');
    if (offset < 0) {
      if (remaining < 0) {
        return L'\xffffffec';
      }
    }
    else {
      if (remaining < 0) {
        return L'\xffffffec';
      }
      wVar2 = gnu_add_sparse_entry(a,tar,offset,remaining);
      remaining = -1;
      if (wVar2 != L'\0') {
        return L'\xffffffe2';
      }
    }
    if (bVar5) {
      return L'\0';
    }
    p = pcVar4 + 1;
    length = length - 1;
    offset = remaining;
  } while( true );
}

Assistant:

static int
gnu_sparse_01_parse(struct archive_read *a, struct tar *tar, const char *p, size_t length)
{
	const char *e;
	int64_t offset = -1, size = -1;

	for (;;) {
		e = p;
		while (length > 0 && *e != ',') {
			if (*e < '0' || *e > '9')
				return (ARCHIVE_WARN);
			e++;
			length--;
		}
		if (offset < 0) {
			offset = tar_atol10(p, e - p);
			if (offset < 0)
				return (ARCHIVE_WARN);
		} else {
			size = tar_atol10(p, e - p);
			if (size < 0)
				return (ARCHIVE_WARN);
			if (gnu_add_sparse_entry(a, tar, offset, size)
			    != ARCHIVE_OK)
				return (ARCHIVE_FATAL);
			offset = -1;
		}
		if (length == 0)
			return (ARCHIVE_OK);
		p = e + 1;
		length--;
	}
}